

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<QString,_QMap<ProKey,_ProStringList>_>_>::freeData
          (Span<QHashPrivate::Node<QString,_QMap<ProKey,_ProStringList>_>_> *this)

{
  Entry *pEVar1;
  byte bVar2;
  Entry *pEVar3;
  int *piVar4;
  long lVar5;
  
  if (this->entries != (Entry *)0x0) {
    lVar5 = 0;
    do {
      bVar2 = this->offsets[lVar5];
      if (bVar2 != 0xff) {
        pEVar3 = this->entries;
        pEVar1 = pEVar3 + bVar2;
        QtPrivate::
        QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
        ::~QExplicitlySharedDataPointerV2
                  ((QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                    *)((pEVar1->storage).data + 0x18));
        piVar4 = *(int **)(pEVar1->storage).data;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            QArrayData::deallocate(*(QArrayData **)pEVar3[bVar2].storage.data,2,0x10);
          }
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x80);
    if (this->entries != (Entry *)0x0) {
      operator_delete__(this->entries);
    }
    this->entries = (Entry *)0x0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }